

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactSonameImportTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactSonameImportTag> *this,
          cmGeneratorTarget *target,cmGeneratorExpressionContext *context,
          GeneratorExpressionContent *content)

{
  bool bVar1;
  TargetType TVar2;
  _Rb_tree_header *config;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  bVar1 = cmGeneratorTarget::IsDLLPlatform((cmGeneratorTarget *)this);
  if (bVar1) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_48,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,
               "TARGET_SONAME_IMPORT_FILE is not allowed for DLL target platforms.",&local_69);
    reportError((cmGeneratorExpressionContext *)target,&local_48,&local_68);
  }
  else {
    TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this);
    if (TVar2 == SHARED_LIBRARY) {
      config = &(target->LinkOptionsCache)._M_t._M_impl.super__Rb_tree_header;
      bVar1 = cmGeneratorTarget::HasImportLibrary((cmGeneratorTarget *)this,(string *)config);
      if (bVar1) {
        cmGeneratorTarget::GetDirectory
                  (&local_48,(cmGeneratorTarget *)this,(string *)config,ImportLibraryArtifact);
        local_69 = (allocator<char>)0x2f;
        cmGeneratorTarget::GetSOName
                  (&local_68,(cmGeneratorTarget *)this,(string *)config,ImportLibraryArtifact);
        cmStrCat<std::__cxx11::string,char,std::__cxx11::string>
                  (__return_storage_ptr__,&local_48,(char *)&local_69,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_48);
        return __return_storage_ptr__;
      }
      goto LAB_003626a1;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_48,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"TARGET_SONAME_IMPORT_FILE is allowed only for SHARED libraries."
               ,&local_69);
    reportError((cmGeneratorExpressionContext *)target,&local_48,&local_68);
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
LAB_003626a1:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context,
                            const GeneratorExpressionContent* content)
  {
    // The target soname file (.so.1).
    if (target->IsDLLPlatform()) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_SONAME_IMPORT_FILE is not allowed "
                    "for DLL target platforms.");
      return std::string();
    }
    if (target->GetType() != cmStateEnums::SHARED_LIBRARY) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_SONAME_IMPORT_FILE is allowed only for "
                    "SHARED libraries.");
      return std::string();
    }

    if (target->HasImportLibrary(context->Config)) {
      return cmStrCat(target->GetDirectory(
                        context->Config, cmStateEnums::ImportLibraryArtifact),
                      '/',
                      target->GetSOName(context->Config,
                                        cmStateEnums::ImportLibraryArtifact));
    }
    return std::string{};
  }